

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O2

void prof_bandage(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  CHAR_DATA *arg2;
  AFFECT_DATA *pAVar3;
  CHAR_DATA *arg2_00;
  char *pcVar4;
  CProficiencies *pCVar5;
  float fVar6;
  string_view fmt;
  
  if (ch == (CHAR_DATA *)0x0) {
    fmt._M_str = "prof_bandage: ch is nullptr";
    fmt._M_len = 0x1b;
    CLogger::Debug<>((CLogger *)&RS.field_0x140,fmt);
    return;
  }
  if (argument == (char *)0x0) {
    pcVar4 = "self";
  }
  else {
    pcVar4 = "self";
    if (*argument != '\0') {
      pcVar4 = argument;
    }
  }
  arg2 = get_char_room(ch,pcVar4);
  if (arg2 == (CHAR_DATA *)0x0) {
    pcVar4 = "They aren\'t here.\n\r";
  }
  else {
    pAVar3 = affect_find(arg2->affected,(int)gsn_bleeding);
    if (pAVar3 == (AFFECT_DATA *)0x0) {
      pcVar4 = "You can only bandage wounds that are bleeding.\n\r";
    }
    else {
      bVar1 = is_affected_prof(ch,"bandage");
      if (!bVar1) {
        add_prof_affect(ch,"bandage",2,false);
        if (arg2 == ch) {
          send_to_char("You bandage your wounds, staunching the worst of the bleeding.\n\r",ch);
          pcVar4 = "$n bandages $s wounds, staunching the worst of $s bleeding.";
          arg2_00 = (CHAR_DATA *)0x0;
        }
        else {
          act("You bandage $N\'s wounds, staunching the worst of $S bleeding.",ch,(void *)0x0,arg2,3
             );
          act("$n bandages your wounds, staunching the worst of the bleeding.",ch,(void *)0x0,arg2,2
             );
          pcVar4 = "$n bandages $N\'s wounds, staunching the worst of $S bleeding.";
          arg2_00 = arg2;
        }
        act(pcVar4,ch,(void *)0x0,arg2_00,(uint)(arg2 != ch));
        pCVar5 = &ch->pcdata->profs;
        if (ch->pcdata == (PC_DATA *)0x0) {
          pCVar5 = &prof_none;
        }
        iVar2 = CProficiencies::GetProf(pCVar5,"bandaging");
        fVar6 = 1.0;
        if (1.0 <= (float)iVar2 * 0.4) {
          fVar6 = (float)iVar2 * 0.4;
        }
        fVar6 = (float)arg2->hit + (float)(int)arg2->level * fVar6;
        if ((float)(int)arg2->max_hit <= fVar6) {
          fVar6 = (float)(int)arg2->max_hit;
        }
        arg2->hit = (int)fVar6;
        pCVar5 = &ch->pcdata->profs;
        if (ch->pcdata == (PC_DATA *)0x0) {
          pCVar5 = &prof_none;
        }
        CProficiencies::CheckImprove(pCVar5,"bandaging",1000);
        WAIT_STATE(ch,0xc);
        return;
      }
      pcVar4 = "That wound has been bandaged too recently.\n\r";
    }
  }
  send_to_char(pcVar4,ch);
  return;
}

Assistant:

void prof_bandage(CHAR_DATA *ch, char *argument)
{
	if (ch == nullptr)
	{
		RS.Logger.Debug("prof_bandage: ch is nullptr");
		return;
	}

	auto victim = argument == nullptr || argument[0] == '\0'
		? get_char_room(ch, "self")
		: get_char_room(ch, argument);

	if (!victim)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	auto baf = affect_find(victim->affected, gsn_bleeding);
	if (!baf)
	{
		send_to_char("You can only bandage wounds that are bleeding.\n\r", ch);
		return;
	}

	if (is_affected_prof(ch, "bandage"))
	{
		send_to_char("That wound has been bandaged too recently.\n\r", ch);
		return;
	}

	//if(baf->level)
	//	baf->level /= 2;

	add_prof_affect(ch, "bandage", 2, false);

	if (victim == ch)
	{
		send_to_char("You bandage your wounds, staunching the worst of the bleeding.\n\r", ch);
		act("$n bandages $s wounds, staunching the worst of $s bleeding.", ch, 0, 0, TO_ROOM);
	}
	else
	{
		act("You bandage $N's wounds, staunching the worst of $S bleeding.", ch, 0, victim, TO_CHAR);
		act("$n bandages your wounds, staunching the worst of the bleeding.", ch, 0, victim, TO_VICT);
		act("$n bandages $N's wounds, staunching the worst of $S bleeding.", ch, 0, victim, TO_NOTVICT);
	}

	float hadd = (std::max(ch->Profs()->GetProf("bandaging") * 0.4, (double)1) * victim->level) + victim->hit;
	victim->hit = std::min((float)victim->max_hit, hadd);
	ch->Profs()->CheckImprove("bandaging", 1000);

	WAIT_STATE(ch, PULSE_VIOLENCE);
}